

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  IVar3 = window->Scroll;
  fVar5 = (window->ScrollTarget).x;
  if (fVar5 < 3.4028235e+38) {
    fVar6 = (window->ScrollTargetCenterRatio).x;
    if ((((!snap_on_edges) || (0.0 < fVar6)) || (fVar7 = 0.0, (window->WindowPadding).x < fVar5)) &&
       ((fVar7 = fVar5, snap_on_edges && (1.0 <= fVar6)))) {
      fVar1 = (window->ContentSize).x;
      fVar2 = (window->WindowPadding).x;
      if (fVar1 + fVar2 + (GImGui->Style).ItemSpacing.x <= fVar5) {
        fVar7 = fVar2 + fVar2 + fVar1;
      }
    }
    IVar3.x = fVar7 - fVar6 * ((window->InnerRect).Max.x - (window->InnerRect).Min.x);
  }
  fVar5 = (window->ScrollTarget).y;
  if (fVar5 < 3.4028235e+38) {
    fVar6 = (window->ScrollTargetCenterRatio).y;
    if (((snap_on_edges) && (fVar6 <= 0.0)) && (fVar5 <= (window->WindowPadding).y)) {
      fVar5 = 0.0;
    }
    if ((snap_on_edges) && (1.0 <= fVar6)) {
      fVar7 = (window->ContentSize).y;
      fVar1 = (window->WindowPadding).y;
      if (fVar7 + fVar1 + (GImGui->Style).ItemSpacing.y <= fVar5) {
        fVar5 = fVar1 + fVar1 + fVar7;
      }
    }
    IVar3.y = fVar5 - fVar6 * ((window->InnerRect).Max.y - (window->InnerRect).Min.y);
  }
  fVar5 = (float)(-(uint)(0.0 <= IVar3.x) & (uint)IVar3.x);
  fVar6 = (float)(-(uint)(0.0 <= IVar3.y) & (uint)IVar3.y);
  IVar4.y = fVar6;
  IVar4.x = fVar5;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    fVar7 = (window->ScrollMax).x;
    if (fVar7 <= fVar5) {
      fVar5 = fVar7;
    }
    fVar7 = (window->ScrollMax).y;
    if (fVar7 <= fVar6) {
      fVar6 = fVar7;
    }
    IVar4.y = fVar6;
    IVar4.x = fVar5;
  }
  return IVar4;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        float target_x = window->ScrollTarget.x;
        if (snap_on_edges && cr_x <= 0.0f && target_x <= window->WindowPadding.x)
            target_x = 0.0f;
        else if (snap_on_edges && cr_x >= 1.0f && target_x >= window->ContentSize.x + window->WindowPadding.x + GImGui->Style.ItemSpacing.x)
            target_x = window->ContentSize.x + window->WindowPadding.x * 2.0f;
        scroll.x = target_x - cr_x * window->InnerRect.GetWidth();
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->ContentSize.y + window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->ContentSize.y + window->WindowPadding.y * 2.0f;
        scroll.y = target_y - cr_y * window->InnerRect.GetHeight();
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}